

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q3_K_ref(float *x,block_q3_K *y,int64_t k)

{
  char cVar1;
  char cVar2;
  ggml_fp16_t gVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar7;
  int l_2;
  int j_4;
  int j_3;
  uint8_t hm;
  int m;
  int l_1;
  int ii;
  float d;
  int j_2;
  int8_t sc;
  int8_t l;
  int j_1;
  float iscale;
  float scale;
  int j;
  float amax;
  float max_scale;
  int i;
  float scales [16];
  int8_t L [256];
  int nb;
  int local_1e4;
  char local_1e0;
  int local_1dc;
  float in_stack_fffffffffffffe34;
  byte local_1c4;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  byte local_19d;
  int local_19c;
  int local_194;
  int local_18c;
  int local_184;
  float in_stack_fffffffffffffe84;
  int iVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  float fStack_168;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  byte local_128 [268];
  int local_1c;
  long local_10;
  long local_8;
  
  local_1c = (int)(in_RDX / 0x100);
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (iVar11 = 0; iVar11 < local_1c; iVar11 = iVar11 + 1) {
    fVar10 = 0.0;
    fVar9 = 0.0;
    for (iVar8 = 0; iVar8 < 0x10; iVar8 = iVar8 + 1) {
      fVar7 = make_q3_quants(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                             (float *)CONCAT44(iVar11,fVar10),(int8_t *)CONCAT44(fVar9,iVar8),
                             SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
      (&fStack_168)[iVar8] = fVar7;
      in_stack_fffffffffffffe84 = ABS((&fStack_168)[iVar8]);
      if (fVar9 < in_stack_fffffffffffffe84) {
        fVar10 = (&fStack_168)[iVar8];
        fVar9 = in_stack_fffffffffffffe84;
      }
    }
    memset((void *)(local_10 + (long)iVar11 * 0x6e + 0x60),0,0xc);
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      for (local_184 = 0; local_184 < 0x10; local_184 = local_184 + 1) {
        iVar8 = nearest_int((-32.0 / fVar10) * (&fStack_168)[local_184]);
        cVar2 = (char)iVar8;
        cVar1 = cVar2;
        if ('\x1f' < cVar2) {
          cVar1 = '\x1f';
        }
        if (cVar1 < -0x20) {
          cVar2 = -0x20;
        }
        else if ('\x1f' < cVar2) {
          cVar2 = '\x1f';
        }
        if (local_184 < 8) {
          *(byte *)(local_10 + (long)iVar11 * 0x6e + 0x60 + (long)local_184) = cVar2 + 0x20U & 0xf;
        }
        else {
          lVar4 = local_10 + (long)iVar11 * 0x6e;
          *(byte *)(lVar4 + 0x60 + (long)(local_184 + -8)) =
               *(byte *)(lVar4 + 0x60 + (long)(local_184 + -8)) | cVar2 << 4;
        }
        lVar4 = local_10 + (long)iVar11 * 0x6e;
        lVar5 = (long)(local_184 % 4 + 8);
        *(byte *)(lVar4 + 0x60 + lVar5) =
             *(byte *)(lVar4 + 0x60 + lVar5) |
             (byte)((int)((char)(cVar2 + 0x20U) >> 4) << ((byte)(local_184 / 4 << 1) & 0x1f));
      }
      gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffe34);
      *(ggml_fp16_t *)(local_10 + (long)iVar11 * 0x6e + 0x6c) = gVar3;
    }
    else {
      gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffe34);
      *(ggml_fp16_t *)(local_10 + (long)iVar11 * 0x6e + 0x6c) = gVar3;
    }
    for (local_18c = 0; local_18c < 0x10; local_18c = local_18c + 1) {
      if (local_18c < 8) {
        local_1c4 = *(byte *)(local_10 + (long)iVar11 * 0x6e + 0x60 + (long)local_18c) & 0xf;
      }
      else {
        local_1c4 = (byte)((int)(uint)*(byte *)(local_10 + (long)iVar11 * 0x6e + 0x60 +
                                               (long)(local_18c + -8)) >> 4);
      }
      in_stack_fffffffffffffe34 =
           (float)(uint)*(byte *)(local_10 + (long)iVar11 * 0x6e + 0x60 + (long)(local_18c % 4 + 8))
      ;
      uVar6 = (int)in_stack_fffffffffffffe34 >> ((byte)(local_18c / 4 << 1) & 0x1f);
      fVar10 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)iVar11 * 0x6e + 0x6c));
      fVar10 = fVar10 * (float)(int)(char)((local_1c4 | (byte)((uVar6 & 3) << 4)) - 0x20);
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        for (local_194 = 0; local_194 < 0x10; local_194 = local_194 + 1) {
          local_1e4 = nearest_int(*(float *)(local_8 + (long)(local_18c * 0x10 + local_194) * 4) /
                                  fVar10);
          local_1dc = local_1e4;
          if (3 < local_1e4) {
            local_1dc = 3;
          }
          if (local_1dc < -4) {
            local_1e0 = -4;
          }
          else {
            if (3 < local_1e4) {
              local_1e4 = 3;
            }
            local_1e0 = (char)local_1e4;
          }
          local_128[local_18c * 0x10 + local_194] = local_1e0 + 4;
        }
      }
    }
    memset((void *)(local_10 + (long)iVar11 * 0x6e),0,0x20);
    local_19c = 0;
    local_19d = 1;
    for (local_1a4 = 0; local_1a4 < 0x100; local_1a4 = local_1a4 + 1) {
      if ('\x03' < (char)local_128[local_1a4]) {
        lVar4 = local_10 + (long)iVar11 * 0x6e;
        *(byte *)(lVar4 + local_19c) = *(byte *)(lVar4 + local_19c) | local_19d;
        local_128[local_1a4] = local_128[local_1a4] - 4;
      }
      local_19c = local_19c + 1;
      if (local_19c == 0x20) {
        local_19c = 0;
        local_19d = local_19d << 1;
      }
    }
    for (local_1a8 = 0; local_1a8 < 0x100; local_1a8 = local_1a8 + 0x80) {
      for (local_1ac = 0; local_1ac < 0x20; local_1ac = local_1ac + 1) {
        *(byte *)(local_10 + (long)iVar11 * 0x6e + 0x20 + (long)(local_1a8 / 4 + local_1ac)) =
             local_128[local_1a8 + local_1ac] | local_128[local_1a8 + local_1ac + 0x20] << 2 |
             local_128[local_1a8 + local_1ac + 0x40] << 4 |
             local_128[local_1a8 + local_1ac + 0x60] << 6;
      }
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q3_K_ref(const float * GGML_RESTRICT x, block_q3_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    int8_t L[QK_K];
    float scales[QK_K / 16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float amax = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            scales[j] = make_q3_quants(16, 4, x + 16*j, L + 16*j, true);
            float scale = fabsf(scales[j]);
            if (scale > amax) {
                amax = scale; max_scale = scales[j];
            }
        }

        memset(y[i].scales, 0, 12);
        if (max_scale) {
            float iscale = -32.f/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int8_t l = nearest_int(iscale*scales[j]);
                l = MAX(-32, MIN(31, l)) + 32;
                if (j < 8) {
                    y[i].scales[j] = l & 0xF;
                } else {
                    y[i].scales[j-8] |= ((l & 0xF) << 4);
                }
                l >>= 4;
                y[i].scales[j%4 + 8] |= (l << (2*(j/4)));
            }
            y[i].d = GGML_FP32_TO_FP16(1/iscale);
        } else {
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }

        int8_t sc;
        for (int j = 0; j < QK_K/16; ++j) {
            sc = j < 8 ? y[i].scales[j] & 0xF : y[i].scales[j-8] >> 4;
            sc = (sc | (((y[i].scales[8 + j%4] >> (2*(j/4))) & 3) << 4)) - 32;
            float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-4, MIN(3, l));
                L[16*j + ii] = l + 4;
            }
        }

        memset(y[i].hmask, 0, QK_K/8);
        // We put the high-bit for the 1st 8 quants into bit 0, the next 8 into bit 1, etc.
        int m = 0;
        uint8_t hm = 1;
        for (int j = 0; j < QK_K; ++j) {
            if (L[j] > 3) {
                y[i].hmask[m] |= hm;
                L[j] -= 4;
            }
            if (++m == QK_K/8) {
                m = 0; hm <<= 1;
            }
        }
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}